

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall MarrayTest::assignmentOperatorTest<true>(MarrayTest *this)

{
  int *data;
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_14;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_15;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_16;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_17;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_19;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_22;
  size_t sVar2;
  size_t sVar3;
  reference piVar4;
  reference piVar5;
  reference piVar6;
  int x;
  int iVar7;
  int iVar8;
  int y_1;
  int z_3;
  int x_1;
  int x_3;
  bool bVar9;
  allocator_type local_105;
  int scalar_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_1;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Marray<int,_std::allocator<unsigned_long>_> n;
  
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,(allocator_type *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,&this->scalar_,&andres::defaultOrder,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,(allocator_type *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if ((sVar2 == sVar3) &&
     (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    iVar7 = *piVar4;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    bVar9 = iVar7 == *piVar4;
  }
  else {
    bVar9 = false;
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar9;
  test((bool *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,(allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (iVar7 = 0; iVar7 != 0x18; iVar7 = iVar7 + 1) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar7);
    iVar8 = *piVar4;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,iVar7);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar8 == *piVar4;
    test((bool *)&shapen_1);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_00._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_00._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_00._M_current = 6;
  begin_00._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,(allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (sVar2 = 0; sVar2 != 6; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7);
      iVar8 = *piVar4;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar2,iVar7);
      shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar8 == *piVar4;
      test((bool *)&shapen_1);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_01._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_01._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_01._M_current = 3;
  begin_01._M_current[1] = 4;
  begin_01._M_current[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,(allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7,iVar8);
        iVar1 = *piVar4;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar2,iVar7,iVar8);
        shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar4;
        test((bool *)&shapen_1);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,(allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&shape);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,&this->scalar_,
             (allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&shape);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    if (sVar2 != sVar3) goto LAB_0019416c;
    piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&n,0);
    iVar7 = *piVar5;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    bVar9 = iVar7 == *piVar4;
  }
  else {
LAB_0019416c:
    bVar9 = false;
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar9;
  test((bool *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin_02._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_02._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_02._M_current = 0x18;
  data = this->data_;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (iVar7 = 0; iVar7 != 0x18; iVar7 = iVar7 + 1) {
    piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&n,iVar7);
    iVar8 = *piVar5;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar7);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar8 == *piVar4;
    test((bool *)&shapen_1);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_03._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_03._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_03._M_current = 6;
  begin_03._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (sVar2 = 0; sVar2 != 6; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&n,sVar2,iVar7);
      iVar8 = *piVar5;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7);
      shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar8 == *piVar4;
      test((bool *)&shapen_1);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_04._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_04._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_04._M_current = 3;
  begin_04._M_current[1] = 4;
  begin_04._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar2 == sVar3;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
        piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&n,sVar2,iVar7,iVar8);
        iVar1 = *piVar5;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7,iVar8);
        shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar4;
        test((bool *)&shapen_1);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&n,&this->scalar_,&andres::defaultOrder,(allocator_type *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,(int *)&shape,&andres::defaultOrder,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&n,&this->scalar_,&andres::defaultOrder,(allocator_type *)&shapen_1);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = piVar6 == piVar4;
  test((bool *)&shapen_1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if ((sVar2 == sVar3) &&
     (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    iVar7 = *piVar4;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar7 == *piVar4;
  }
  else {
    shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,(allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,&this->scalar_,&andres::defaultOrder,(allocator_type *)&shape);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,&this->scalar_,
             (allocator_type *)&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,&this->scalar_,&andres::defaultOrder,(allocator_type *)&shape);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = piVar6 == piVar4;
  test((bool *)&shape);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    if (sVar2 == sVar3) {
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&n,0);
      iVar7 = *piVar5;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
      bVar9 = iVar7 == *piVar4;
      goto LAB_00194778;
    }
  }
  bVar9 = false;
LAB_00194778:
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar9;
  test((bool *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&n);
  begin_05._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_05._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_05._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  scalar_1 = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin_06._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_06._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_06._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&scalar_1,&andres::defaultOrder,
             (allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,1,(allocator_type *)&n);
  begin_17._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_17._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_17._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_17,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,&local_105);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  local_105 = (allocator_type)(piVar6 == piVar4);
  test((bool *)&local_105);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    local_105 = (allocator_type)(sVar2 == sVar3);
  }
  else {
    local_105 = (allocator_type)0x0;
  }
  test((bool *)&local_105);
  for (iVar7 = 0; iVar7 != 0x18; iVar7 = iVar7 + 1) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar7);
    iVar8 = *piVar4;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,iVar7);
    local_105 = (allocator_type)(iVar8 == *piVar4);
    test((bool *)&local_105);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,(allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin_07._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_07._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_07._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin_08._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_08._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_08._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,1,(allocator_type *)&m);
  begin_18._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_18._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_18._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_18,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&scalar_1);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  scalar_1 = CONCAT31(scalar_1._1_3_,piVar6 == piVar4);
  test((bool *)&scalar_1);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar9 = sVar2 == sVar3;
  }
  else {
    bVar9 = false;
  }
  scalar_1 = CONCAT31(scalar_1._1_3_,bVar9);
  test((bool *)&scalar_1);
  for (iVar7 = 0; iVar7 != 0x18; iVar7 = iVar7 + 1) {
    piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&n,iVar7);
    iVar8 = *piVar5;
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar7);
    scalar_1 = CONCAT31(scalar_1._1_3_,iVar8 == *piVar4);
    test((bool *)&scalar_1);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&n);
  begin_09._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_09._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_09._M_current = 4;
  begin_09._M_current[1] = 6;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  scalar_1 = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_10._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_10._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_10._M_current = 6;
  begin_10._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&scalar_1,&andres::defaultOrder,
             (allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,2,(allocator_type *)&n);
  begin_19._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_19._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_19._M_current = 6;
  begin_19._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_19,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,&local_105);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  local_105 = (allocator_type)(piVar6 == piVar4);
  test((bool *)&local_105);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    local_105 = (allocator_type)(sVar2 == sVar3);
  }
  else {
    local_105 = (allocator_type)0x0;
  }
  test((bool *)&local_105);
  for (sVar2 = 0; sVar2 != 6; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7);
      iVar8 = *piVar4;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar2,iVar7);
      local_105 = (allocator_type)(iVar8 == *piVar4);
      test((bool *)&local_105);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,(allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_11._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_11._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_11._M_current = 4;
  begin_11._M_current[1] = 6;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_12._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_12._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_12._M_current = 6;
  begin_12._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,2,(allocator_type *)&m);
  begin_20._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_20._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_20._M_current = 6;
  begin_20._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_20,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&scalar_1);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  scalar_1 = CONCAT31(scalar_1._1_3_,piVar6 == piVar4);
  test((bool *)&scalar_1);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar9 = sVar2 == sVar3;
  }
  else {
    bVar9 = false;
  }
  scalar_1 = CONCAT31(scalar_1._1_3_,bVar9);
  test((bool *)&scalar_1);
  for (sVar2 = 0; sVar2 != 6; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&n,sVar2,iVar7);
      iVar8 = *piVar5;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7);
      scalar_1 = CONCAT31(scalar_1._1_3_,iVar8 == *piVar4);
      test((bool *)&scalar_1);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&n);
  begin_13._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_13._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_13._M_current = 2;
  begin_13._M_current[1] = 3;
  begin_13._M_current[2] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  scalar_1 = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_14._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_14._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_14._M_current = 3;
  begin_14._M_current[1] = 4;
  begin_14._M_current[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_14,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&scalar_1,&andres::defaultOrder,
             (allocator_type *)&n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,3,(allocator_type *)&n);
  begin_21._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_21._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_21._M_current = 3;
  begin_21._M_current[1] = 4;
  begin_21._M_current[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&n,begin_21,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,&local_105);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=(&n,&m);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  local_105 = (allocator_type)(piVar6 == piVar4);
  test((bool *)&local_105);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    local_105 = (allocator_type)(sVar2 == sVar3);
  }
  else {
    local_105 = (allocator_type)0x0;
  }
  test((bool *)&local_105);
  for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7,iVar8);
        iVar1 = *piVar4;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar2,iVar7,iVar8);
        local_105 = (allocator_type)(iVar1 == *piVar4);
        test((bool *)&local_105);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&n,(allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_15._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_15._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_15._M_current = 2;
  begin_15._M_current[1] = 3;
  begin_15._M_current[2] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_15,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&shapen_1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_16._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_16._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_16._M_current = 3;
  begin_16._M_current[1] = 4;
  begin_16._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&n,begin_16,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shapen_1,3,(allocator_type *)&m);
  begin_22._M_current._1_7_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_22._M_current._0_1_ =
       shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_22._M_current = 3;
  begin_22._M_current[1] = 4;
  begin_22._M_current[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_22,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&scalar_1);
  piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&n);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  scalar_1 = CONCAT31(scalar_1._1_3_,piVar6 == piVar4);
  test((bool *)&scalar_1);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&n);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    bVar9 = sVar2 == sVar3;
  }
  else {
    bVar9 = false;
  }
  scalar_1 = CONCAT31(scalar_1._1_3_,bVar9);
  test((bool *)&scalar_1);
  for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
        piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&n,sVar2,iVar7,iVar8);
        iVar1 = *piVar5;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar2,iVar7,iVar8);
        scalar_1 = CONCAT31(scalar_1._1_3_,iVar1 == *piVar4);
        test((bool *)&scalar_1);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void MarrayTest::assignmentOperatorTest(){
    // empty
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n;
                n = m;
            }
            // scalar
            {
                andres::Marray<int> m(scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);

                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
            // 3D 
            {
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m;
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
    // scalar
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n(scalar_);
                n = m;
            }
            // scalar
            {
                int scalar = 2;
                andres::Marray<int> m(scalar);
                andres::Marray<int> n(scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m(scalar_);
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m(scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
        }
    }
    // 1D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 1D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address
                );
                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                m = v;
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
        }
    }
    // 2D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 2D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() && v.dimension()==m.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
        }
    }
    // 3D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 3D 
            {
                int scalar = 2;
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
}